

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

void kwssys::RegExpCompile::regtail(char *p,char *val)

{
  ushort uVar1;
  char *pcVar2;
  
  if (p != &regdummy) {
    do {
      pcVar2 = p;
      if ((pcVar2 == &regdummy) ||
         (uVar1 = *(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8, uVar1 == 0)) {
        p = (char *)0x0;
      }
      else if (*pcVar2 == '\a') {
        p = pcVar2 + -(ulong)uVar1;
      }
      else {
        p = pcVar2 + uVar1;
      }
    } while (p != (char *)0x0);
    uVar1 = (short)val - (short)pcVar2;
    if (*pcVar2 == '\a') {
      uVar1 = (short)pcVar2 - (short)val;
    }
    *(ushort *)(pcVar2 + 1) = uVar1 << 8 | uVar1 >> 8;
  }
  return;
}

Assistant:

void RegExpCompile::regtail(char* p, const char* val)
{
  char* scan;
  char* temp;
  int offset;

  if (p == regdummyptr)
    return;

  // Find last node.
  scan = p;
  for (;;) {
    temp = regnext(scan);
    if (temp == nullptr)
      break;
    scan = temp;
  }

  if (OP(scan) == BACK)
    offset = int(scan - val);
  else
    offset = int(val - scan);
  *(scan + 1) = static_cast<char>((offset >> 8) & 0377);
  *(scan + 2) = static_cast<char>(offset & 0377);
}